

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O3

uint32_t get_I(istream *is)

{
  istream *piVar1;
  uint32_t uVar2;
  uint uVar3;
  char ch;
  char local_51;
  string local_50;
  
  uVar3 = 0;
  uVar2 = 0;
  do {
    piVar1 = std::operator>>(is,&local_51);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      return uVar2;
    }
    if (local_51 == 'I') {
      uVar2 = uVar2 + 1;
      uVar3 = uVar3 + 1;
    }
    else if (local_51 == 'V') {
      if (uVar3 != 0) {
        return uVar2 + 3;
      }
      uVar2 = uVar2 + 5;
      uVar3 = 0;
    }
    else {
      if (local_51 == 'X') {
        return uVar2 + 8;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid roman numeral.","");
      error(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  } while (uVar3 < 3);
  return uVar2;
}

Assistant:

uint32_t get_I(std::istream& is)
{
	uint32_t num{ 0 };
	char ch;
	uint32_t repeats{ 0 };
	while (repeats < Roman_int::max_repeating_numerals && is >> ch)
	{
		switch (ch)
		{
		case 'X':
			return num + 8;
		case 'V':
		{
			if (repeats > 0)
			{
				return num + 3;
			}
			else
			{
				num += 5;
			}
			break;
		}
		case 'I':
		{
			num += 1;
			++repeats;
			break;
		}
		default:
			error("Invalid roman numeral.");
		}
	}
	return num;
}